

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O2

void __thiscall
ECdecoding::fanoCheck(ECdecoding *this,SeqEntry *sequence,char2double *nextProbs,char base)

{
  type pdVar1;
  char cVar2;
  char base_local;
  SeqEntry newSeq;
  
  if ((sequence->seq)._M_string_length <= (ulong)this->messageLen) {
    base_local = base;
    pdVar1 = robin_hood::detail::
             Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
             operator[]<double>(nextProbs,&base_local);
    if (*pdVar1 != 0.0) {
      cVar2 = 'N';
      if ((ulong)sequence->pos < (this->readSeq)._M_string_length) {
        cVar2 = (this->readSeq)._M_dataplus._M_p[sequence->pos];
      }
      if (cVar2 == base_local) {
        SeqEntry::SeqEntry(&newSeq,sequence);
        updateState(this,&newSeq,true,nextProbs,base_local,1);
      }
      else {
        SeqEntry::SeqEntry(&newSeq,sequence);
        updateState(this,&newSeq,false,nextProbs,base_local,1);
      }
      SeqEntry::~SeqEntry(&newSeq);
    }
  }
  return;
}

Assistant:

void ECdecoding::fanoCheck(SeqEntry &sequence, char2double &nextProbs, char base) {
    //switched sequence.pos to sequence.seq.size(), as it would lead to wrong results if indels are present
    if (sequence.seq.size() > messageLen)
        return;
    if (static_cast<bool>(nextProbs[base])) {
        //Input sequence at pos x == candidate sequence at pos x
        if (defaultReturn(readSeq, sequence.pos) == base) {
            SeqEntry newSeq = sequence;
            updateState(newSeq, true, nextProbs, base, 1);
        } else {
            SeqEntry newSeq = sequence;
            updateState(newSeq, false, nextProbs, base, 1);
        }
    }
}